

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void simd::BitwiseOr(Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,uint32_t startX2,
                    uint32_t startY2,Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t width
                    ,uint32_t height,SIMDType simdType)

{
  uint8_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t rowSizeIn2_00;
  uint32_t rowSizeOut_00;
  uint uVar5;
  uint32_t nonSimdWidth_00;
  uchar *puVar6;
  uchar *puVar7;
  uchar *puVar8;
  uint8_t *outY_00;
  ImageTemplate<unsigned_char> *in_RCX;
  int in_EDX;
  int in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  int in_R8D;
  int in_R9D;
  Image *unaff_retaddr;
  uint32_t in_stack_00000008;
  undefined4 in_stack_0000000c;
  uint32_t in_stack_00000010;
  uint32_t in_stack_00000018;
  uint32_t in_stack_00000020;
  SIMDType in_stack_00000028;
  SIMDType in_stack_00000030;
  uint32_t nonSimdWidth;
  uint32_t totalSimdWidth;
  uint32_t simdWidth;
  uint8_t *outYEnd;
  uint8_t *outY;
  uint8_t *in2Y;
  uint8_t *in1Y;
  uint32_t rowSizeOut;
  uint32_t rowSizeIn2;
  uint32_t rowSizeIn1;
  uint32_t simdSize;
  uint8_t colorCount;
  ImageTemplate<unsigned_char> *image;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  SIMDType nonSimdWidth_01;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  uint32_t in_stack_ffffffffffffff18;
  uint32_t in_stack_ffffffffffffff1c;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff20;
  uint32_t in_stack_ffffffffffffff28;
  uint32_t in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff40;
  uint32_t in_stack_ffffffffffffff48;
  uint32_t in_stack_ffffffffffffff50;
  uint32_t in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff60;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff70;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff78;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff80;
  uint32_t *in_stack_ffffffffffffff88;
  uint32_t *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffc4;
  
  uVar1 = Image_Function::CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>
                    ((ImageTemplate<unsigned_char> *)
                     CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (ImageTemplate<unsigned_char> *)
                     CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     (ImageTemplate<unsigned_char> *)
                     CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  uVar5 = CONCAT13(uVar1,(int3)in_stack_ffffffffffffffc4);
  uVar2 = getSimdSize(in_stack_00000030);
  if ((in_stack_00000030 == cpu_function) || (in_stack_00000020 * (uVar5 >> 0x18) < uVar2)) {
    uVar4 = (uint32_t)((ulong)in_RCX >> 0x20);
    if (in_stack_00000030 == avx_function) {
      BitwiseOr((Image *)CONCAT44(in_ESI,in_EDX),uVar4,(uint32_t)in_RCX,
                (Image *)CONCAT44(in_R8D,in_R9D),uVar5,uVar2,unaff_retaddr,in_stack_00000008,
                in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028);
    }
    else {
      Image_Function::BitwiseOr
                ((Image *)CONCAT44(in_ESI,in_EDX),uVar4,(uint32_t)in_RCX,
                 (Image *)CONCAT44(in_R8D,in_R9D),uVar5,uVar2,unaff_retaddr,in_stack_00000008,
                 in_stack_00000010,in_stack_00000018,in_stack_00000020);
    }
  }
  else {
    image = (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_0000000c,in_stack_00000008);
    uVar4 = in_stack_00000010;
    nonSimdWidth_01 = in_stack_00000028;
    Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
              ((ImageTemplate<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff48,in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,
               in_stack_ffffffffffffff60);
    uVar3 = in_stack_00000020 * (uVar5 >> 0x18);
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffef4,uVar4),image);
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffef4,uVar4),image);
    Image_Function::
    OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x135f56);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x135f63);
    uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
    rowSizeIn2_00 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RCX);
    rowSizeOut_00 =
         PenguinV_Image::ImageTemplate<unsigned_char>::rowSize
                   ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_0000000c,in_stack_00000008));
    puVar6 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
    puVar6 = puVar6 + (ulong)(in_ESI * (uVar5 >> 0x18)) + (ulong)(in_EDX * uVar4);
    puVar7 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RCX);
    puVar7 = puVar7 + (ulong)(in_R8D * (uVar5 >> 0x18)) + (ulong)(in_R9D * rowSizeIn2_00);
    puVar8 = PenguinV_Image::ImageTemplate<unsigned_char>::data
                       ((ImageTemplate<unsigned_char> *)
                        CONCAT44(in_stack_0000000c,in_stack_00000008));
    outY_00 = puVar8 + (ulong)(in_stack_00000010 * (uVar5 >> 0x18)) +
                       (ulong)(in_stack_00000018 * rowSizeOut_00);
    uVar5 = uVar3 / uVar2;
    uVar2 = uVar5 * uVar2;
    nonSimdWidth_00 = uVar3 - uVar2;
    if (in_stack_00000030 == avx_function) {
      avx::BitwiseOr((uint32_t)((ulong)puVar7 >> 0x20),(uint32_t)puVar7,
                     (uint32_t)((ulong)outY_00 >> 0x20),outY_00 + in_stack_00000028 * rowSizeOut_00,
                     (uint8_t *)CONCAT44(uVar5,uVar2),
                     (uint8_t *)CONCAT44(nonSimdWidth_00,in_stack_ffffffffffffff28),
                     (uint8_t *)CONCAT44(in_stack_fffffffffffffef4,uVar5),uVar2,nonSimdWidth_00,
                     nonSimdWidth_01);
    }
    else if (in_stack_00000030 == sse_function) {
      sse::BitwiseOr(uVar4,rowSizeIn2_00,rowSizeOut_00,puVar6,puVar7,outY_00,
                     outY_00 + in_stack_00000028 * rowSizeOut_00,uVar5,uVar2,nonSimdWidth_00);
    }
  }
  return;
}

Assistant:

void BitwiseOr( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                    Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height, SIMDType simdType )
    {
        const uint8_t colorCount = Image_Function::CommonColorCount( in1, in2, out );
        const uint32_t simdSize = getSimdSize( simdType );

        if( (simdType == cpu_function) || (width * colorCount < simdSize) ) {
            AVX_CODE( BitwiseOr( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height, sse_function ); )

            Image_Function::BitwiseOr( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );
            return;
        }

        Image_Function::ParameterValidation( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );
        width = width * colorCount;

        Image_Function::OptimiseRoi( width, height, in1, in2, out );

        const uint32_t rowSizeIn1 = in1.rowSize();
        const uint32_t rowSizeIn2 = in2.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * in1Y = in1.data() + startY1   * rowSizeIn1 + startX1   * colorCount;
        const uint8_t * in2Y = in2.data() + startY2   * rowSizeIn2 + startX2   * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        AVX_CODE( avx::BitwiseOr( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        SSE_CODE( sse::BitwiseOr( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::BitwiseOr( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
    }